

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O2

void __thiscall
duckdb::SetVariableStatement::SetVariableStatement
          (SetVariableStatement *this,SetVariableStatement *other)

{
  pointer pPVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)&(other->super_SetStatement).name);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&other->value);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_38,pPVar1);
  SetVariableStatement
            (this,&local_30,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_38,(other->super_SetStatement).scope);
  if (local_38._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_38._M_head_impl = (ParsedExpression *)0x0;
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

SetVariableStatement::SetVariableStatement(const SetVariableStatement &other)
    : SetVariableStatement(other.name, other.value->Copy(), other.scope) {
}